

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaFree(xmlSchemaPtr schema)

{
  xmlGenericErrorFunc p_Var1;
  xmlSchemaItemListPtr list_00;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  int local_1c;
  int i;
  xmlSchemaItemListPtr list;
  xmlSchemaPtr schema_local;
  
  if (schema != (xmlSchemaPtr)0x0) {
    if (schema->volatiles != (void *)0x0) {
      pp_Var2 = __xmlGenericError();
      p_Var1 = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      (*p_Var1)(*ppvVar3,"Unimplemented block at %s:%d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xmlschemas.c"
                ,0x1059);
    }
    if (schema->notaDecl != (xmlHashTablePtr)0x0) {
      xmlHashFree(schema->notaDecl,(xmlHashDeallocator)0x0);
    }
    if (schema->attrDecl != (xmlHashTablePtr)0x0) {
      xmlHashFree(schema->attrDecl,(xmlHashDeallocator)0x0);
    }
    if (schema->attrgrpDecl != (xmlHashTablePtr)0x0) {
      xmlHashFree(schema->attrgrpDecl,(xmlHashDeallocator)0x0);
    }
    if (schema->elemDecl != (xmlHashTablePtr)0x0) {
      xmlHashFree(schema->elemDecl,(xmlHashDeallocator)0x0);
    }
    if (schema->typeDecl != (xmlHashTablePtr)0x0) {
      xmlHashFree(schema->typeDecl,(xmlHashDeallocator)0x0);
    }
    if (schema->groupDecl != (xmlHashTablePtr)0x0) {
      xmlHashFree(schema->groupDecl,(xmlHashDeallocator)0x0);
    }
    if (schema->idcDef != (xmlHashTablePtr)0x0) {
      xmlHashFree(schema->idcDef,(xmlHashDeallocator)0x0);
    }
    if (schema->schemasImports != (xmlHashTablePtr)0x0) {
      xmlHashFree(schema->schemasImports,xmlSchemaBucketFreeEntry);
    }
    if (schema->includes != (void *)0x0) {
      list_00 = (xmlSchemaItemListPtr)schema->includes;
      for (local_1c = 0; local_1c < list_00->nbItems; local_1c = local_1c + 1) {
        xmlSchemaBucketFree((xmlSchemaBucketPtr_conflict)list_00->items[local_1c]);
      }
      xmlSchemaItemListFree(list_00);
    }
    if (schema->annot != (xmlSchemaAnnotPtr)0x0) {
      xmlSchemaFreeAnnot(schema->annot);
    }
    xmlDictFree(schema->dict);
    (*xmlFree)(schema);
  }
  return;
}

Assistant:

void
xmlSchemaFree(xmlSchemaPtr schema)
{
    if (schema == NULL)
        return;
    /* @volatiles is not used anymore :-/ */
    if (schema->volatiles != NULL)
	TODO
    /*
    * Note that those slots are not responsible for freeing
    * schema components anymore; this will now be done by
    * the schema buckets.
    */
    if (schema->notaDecl != NULL)
        xmlHashFree(schema->notaDecl, NULL);
    if (schema->attrDecl != NULL)
        xmlHashFree(schema->attrDecl, NULL);
    if (schema->attrgrpDecl != NULL)
        xmlHashFree(schema->attrgrpDecl, NULL);
    if (schema->elemDecl != NULL)
        xmlHashFree(schema->elemDecl, NULL);
    if (schema->typeDecl != NULL)
        xmlHashFree(schema->typeDecl, NULL);
    if (schema->groupDecl != NULL)
        xmlHashFree(schema->groupDecl, NULL);
    if (schema->idcDef != NULL)
        xmlHashFree(schema->idcDef, NULL);

    if (schema->schemasImports != NULL)
	xmlHashFree(schema->schemasImports, xmlSchemaBucketFreeEntry);
    if (schema->includes != NULL) {
	xmlSchemaItemListPtr list = (xmlSchemaItemListPtr) schema->includes;
	int i;
	for (i = 0; i < list->nbItems; i++) {
	    xmlSchemaBucketFree((xmlSchemaBucketPtr) list->items[i]);
	}
	xmlSchemaItemListFree(list);
    }
    if (schema->annot != NULL)
        xmlSchemaFreeAnnot(schema->annot);
    /* Never free the doc here, since this will be done by the buckets. */

    xmlDictFree(schema->dict);
    xmlFree(schema);
}